

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::CreateHDLCFrame
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *address,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *control,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *information)

{
  const_iterator __first;
  const_iterator __last;
  iterator __first_00;
  iterator __last_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  const_iterator local_e8;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fcs;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  const_iterator local_a8;
  uchar *local_a0;
  uchar *local_98;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  const_iterator local_80;
  uchar *local_78;
  uchar *local_60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> allFields;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *information_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *address_local;
  HdlcSimulationDataGenerator *this_local;
  
  allFields.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)information;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  local_50._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_48,&local_50);
  local_58._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(address);
  local_60 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(address);
  local_78 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,
                                 local_48,local_58,
                                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_60);
  local_88._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_80,&local_88);
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(control);
  local_98 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(control);
  local_a0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,
                                 local_80,local_90,
                                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_98);
  local_b0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_a8,&local_b0);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       allFields.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      allFields.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  fcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_a8,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )__first._M_current,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )__last._M_current);
  GenFcs((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,this,
         this->mSettings->mHdlcFcs,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40
        );
  local_f0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_e8,&local_f0);
  __first_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  __last_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_e8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first_00._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last_00._M_current);
  if (this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    TransmitBitSync(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  else {
    TransmitByteAsync(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::CreateHDLCFrame( const vector<U8>& address, const vector<U8>& control, const vector<U8>& information )
{
    vector<U8> allFields;

    allFields.insert( allFields.end(), address.begin(), address.end() );
    allFields.insert( allFields.end(), control.begin(), control.end() );
    allFields.insert( allFields.end(), information.begin(), information.end() );

    // Calculate the crc of the address, control and data fields
    vector<U8> fcs = GenFcs( mSettings->mHdlcFcs, allFields );
    allFields.insert( allFields.end(), fcs.begin(), fcs.end() );

    // Transmit the frame in bit-sync or byte-async
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        TransmitBitSync( allFields );
    }
    else
    {
        TransmitByteAsync( allFields );
    }
}